

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  float _x;
  float _y;
  ImVec2 *local_38;
  ImVec2 local_30;
  float local_28;
  int local_24;
  float a;
  int i;
  float local_18;
  float fStack_14;
  ImDrawListSharedData *local_10;
  ImDrawListSharedData *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->TexUvWhitePixel);
  ImVec4::ImVec4(&this->ClipRectFullscreen);
  local_38 = this->CircleVtx12;
  do {
    ImVec2::ImVec2(local_38);
    local_38 = local_38 + 1;
  } while ((ImDrawListSharedData *)local_38 != this + 1);
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->CurveTessellationTol = 0.0;
  ImVec4::ImVec4((ImVec4 *)&a,-8192.0,-8192.0,8192.0,8192.0);
  (this->ClipRectFullscreen).x = a;
  (this->ClipRectFullscreen).y = (float)i;
  (this->ClipRectFullscreen).z = local_18;
  (this->ClipRectFullscreen).w = fStack_14;
  for (local_24 = 0; local_24 < 0xc; local_24 = local_24 + 1) {
    local_28 = ((float)local_24 * 2.0 * 3.1415927) / 12.0;
    _x = ImCos(local_28);
    _y = ImSin(local_28);
    ImVec2::ImVec2(&local_30,_x,_y);
    this->CircleVtx12[local_24] = local_30;
  }
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    Font = NULL;
    FontSize = 0.0f;
    CurveTessellationTol = 0.0f;
    ClipRectFullscreen = ImVec4(-8192.0f, -8192.0f, +8192.0f, +8192.0f);

    // Const data
    for (int i = 0; i < IM_ARRAYSIZE(CircleVtx12); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(CircleVtx12);
        CircleVtx12[i] = ImVec2(ImCos(a), ImSin(a));
    }
}